

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.c
# Opt level: O3

Value * apply_assign_operation(Value *left_value,Value *right_value,Operator operator)

{
  Value *pVVar1;
  
  switch(operator) {
  case ASSIGN_OP:
    return right_value;
  default:
    pVVar1 = new_null_value();
    return pVVar1;
  case ASSIGN_ADDITION_OP:
    pVVar1 = apply_addition_operation(left_value,right_value);
    return pVVar1;
  case ASSIGN_SUBTRACTION_OP:
    pVVar1 = apply_subtraction_operation(left_value,right_value);
    return pVVar1;
  case ASSIGN_MULTIPLICATION_OP:
    pVVar1 = apply_multiplication_operation(left_value,right_value);
    return pVVar1;
  case ASSIGN_DIVISION_OP:
    pVVar1 = apply_division_operation(left_value,right_value,false);
    return pVVar1;
  case ASSIGN_INTEGER_DIVISION_OP:
    pVVar1 = apply_division_operation(left_value,right_value,true);
    return pVVar1;
  case ASSIGN_EXPONENT_OP:
    pVVar1 = apply_exponent_operation(left_value,right_value);
    return pVVar1;
  case ASSIGN_MOD_OP:
    pVVar1 = apply_mod_operation(left_value,right_value);
    return pVVar1;
  }
}

Assistant:

Value *apply_assign_operation(Value *left_value, Value *right_value, Operator operator) {
  Value *result_value = NULL;

  switch (operator) {
    case ASSIGN_OP: {
      result_value = right_value;
      break;
    }

    case ASSIGN_ADDITION_OP:{
      result_value = apply_addition_operation(left_value, right_value);

      break;
    }

    case ASSIGN_SUBTRACTION_OP:{
      result_value = apply_subtraction_operation(left_value, right_value);
      break;
    }

    case ASSIGN_MULTIPLICATION_OP:{
      result_value = apply_multiplication_operation(left_value, right_value);
      break;
    }

    case ASSIGN_DIVISION_OP:{
      result_value = apply_division_operation(left_value, right_value, false);
      break;
    }

    case ASSIGN_INTEGER_DIVISION_OP:{
      result_value = apply_division_operation(left_value, right_value, true);
      break;
    }

    case ASSIGN_EXPONENT_OP:{
      result_value = apply_exponent_operation(left_value, right_value);
      break;
    }

    case ASSIGN_MOD_OP:{
      result_value = apply_mod_operation(left_value, right_value);
      break;
    }

    default: {
      result_value = new_null_value();
      break;
    }
  }

  return result_value;
}